

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O1

BasicBlock * create_block(Proc *proc)

{
  C_MemoryAllocator *pCVar1;
  BasicBlock **__dest;
  BasicBlock *pBVar2;
  uint uVar3;
  
  pCVar1 = proc->linearizer->compiler_state->allocator;
  if (proc->allocated <= proc->node_count) {
    uVar3 = proc->allocated + 0x19;
    __dest = (BasicBlock **)(*pCVar1->calloc)(pCVar1->arena,(size_t)uVar3,8);
    if (__dest == (BasicBlock **)0x0) {
      __assert_fail("new_data != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/linearizer.c"
                    ,0xb74,"BasicBlock *create_block(Proc *)");
    }
    if (proc->node_count != 0) {
      memcpy(__dest,proc->nodes,(ulong)proc->allocated << 3);
    }
    proc->allocated = uVar3;
    proc->nodes = __dest;
  }
  if (proc->node_count < proc->allocated) {
    pBVar2 = (BasicBlock *)(*pCVar1->calloc)(pCVar1->arena,1,0x10);
    uVar3 = proc->node_count;
    pBVar2->index = uVar3;
    proc->node_count = uVar3 + 1;
    proc->nodes[uVar3] = pBVar2;
    return pBVar2;
  }
  __assert_fail("proc->node_count < proc->allocated",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/linearizer.c"
                ,0xb7b,"BasicBlock *create_block(Proc *)");
}

Assistant:

static BasicBlock *create_block(Proc *proc)
{
	C_MemoryAllocator *allocator = proc->linearizer->compiler_state->allocator;
	if (proc->node_count >= proc->allocated) {
		unsigned new_size = proc->allocated + 25;
		BasicBlock **new_data = (BasicBlock **)
		    allocator->calloc(allocator->arena, new_size, sizeof(BasicBlock *));
		assert(new_data != NULL);
		if (proc->node_count > 0) {
			memcpy(new_data, proc->nodes, proc->allocated * sizeof(BasicBlock *));
		}
		proc->allocated = new_size;
		proc->nodes = new_data;
	}
	assert(proc->node_count < proc->allocated);
	BasicBlock *new_block = (BasicBlock *) allocator->calloc(allocator->arena, 1, sizeof(BasicBlock));
	/* note that each block must have an index that can be used to access the block as nodes[index] */
	new_block->index = proc->node_count;
	proc->nodes[proc->node_count++] = new_block;
	return new_block;
}